

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_vector_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::MotionVectorTestLarge::PreEncodeFrameHook(MotionVectorTestLarge *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  MotionVectorTestLarge *in_stack_00000020;
  
  anon_unknown.dwarf_1337e35::MotionVectorTestLarge::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AV1E_ENABLE_MOTION_VECTOR_UNIT_TEST, mv_test_mode_);
      if (encoding_mode_ != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }